

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

Port * __thiscall Vault::Client::getPort_abi_cxx11_(Port *__return_storage_ptr__,Client *this)

{
  Client *this_local;
  
  Tiny<Vault::PortDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(__return_storage_ptr__,
         (Tiny<Vault::PortDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(this + 0x30));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Port getPort() const { return port_; }